

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O0

void __thiscall dg::DGLLVMPointerAnalysis::initialize(DGLLVMPointerAnalysis *this)

{
  bool bVar1;
  pointer this_00;
  LLVMPointerAnalysisOptions *in_RDI;
  LLVMPointerGraphBuilder *unaff_retaddr;
  PointerGraph *in_stack_00000008;
  DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFS> *in_stack_00000010;
  pointer in_stack_ffffffffffffffa8;
  pointer __p;
  LLVMPointerGraphBuilder *in_stack_ffffffffffffffb0;
  unique_ptr<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_> *this_01;
  PointerGraph *in_stack_ffffffffffffffb8;
  DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFI> *this_02;
  LLVMPointerAnalysisOptions *opts;
  
  opts = in_RDI;
  bVar1 = LLVMPointerAnalysisOptions::isFSInv
                    ((LLVMPointerAnalysisOptions *)&(in_RDI->super_LLVMAnalysisOptions).field_0x8);
  if (bVar1) {
    this_00 = std::
              unique_ptr<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
              ::operator->((unique_ptr<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
                            *)0x167213);
    pta::LLVMPointerGraphBuilder::setInvalidateNodesFlag(this_00,true);
  }
  buildSubgraph((DGLLVMPointerAnalysis *)in_stack_ffffffffffffffb0);
  bVar1 = LLVMPointerAnalysisOptions::isFS
                    ((LLVMPointerAnalysisOptions *)&(in_RDI->super_LLVMAnalysisOptions).field_0x8);
  if (bVar1) {
    operator_new(0xa8);
    std::
    unique_ptr<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
    ::get((unique_ptr<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
           *)0x167277);
    DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFS>::DGLLVMPointerAnalysisImpl
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,opts);
    std::unique_ptr<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>::reset
              ((unique_ptr<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
                *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    bVar1 = LLVMPointerAnalysisOptions::isFI
                      ((LLVMPointerAnalysisOptions *)&(in_RDI->super_LLVMAnalysisOptions).field_0x8)
    ;
    if (bVar1) {
      operator_new(0xa8);
      this_02 = *(DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFI> **)
                 &in_RDI[1].super_LLVMAnalysisOptions.field_0x8;
      std::
      unique_ptr<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
      ::get((unique_ptr<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
             *)0x1672f3);
      DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFI>::DGLLVMPointerAnalysisImpl
                (this_02,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                 (LLVMPointerAnalysisOptions *)in_stack_ffffffffffffffa8);
      std::unique_ptr<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>::
      reset((unique_ptr<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_> *)
            in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    else {
      bVar1 = LLVMPointerAnalysisOptions::isFSInv
                        ((LLVMPointerAnalysisOptions *)
                         &(in_RDI->super_LLVMAnalysisOptions).field_0x8);
      if (!bVar1) {
        abort();
      }
      this_01 = (unique_ptr<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
                 *)&in_RDI[1].super_LLVMAnalysisOptions.field_0x10;
      operator_new(0xa8);
      __p = *(pointer *)&in_RDI[1].super_LLVMAnalysisOptions.field_0x8;
      std::
      unique_ptr<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
      ::get((unique_ptr<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
             *)0x16736b);
      DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFSInv>::DGLLVMPointerAnalysisImpl
                ((DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFSInv> *)in_stack_00000010,
                 in_stack_00000008,unaff_retaddr,opts);
      std::unique_ptr<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>::
      reset(this_01,__p);
    }
  }
  return;
}

Assistant:

void initialize() {
        if (options.isFSInv())
            _builder->setInvalidateNodesFlag(true);

        buildSubgraph();

        if (options.isFS()) {
            // FIXME: make a interface with run() method
            PTA.reset(new DGLLVMPointerAnalysisImpl<pta::PointerAnalysisFS>(
                    PS, _builder.get(), options));
        } else if (options.isFI()) {
            PTA.reset(new DGLLVMPointerAnalysisImpl<pta::PointerAnalysisFI>(
                    PS, _builder.get(), options));
        } else if (options.isFSInv()) {
            PTA.reset(new DGLLVMPointerAnalysisImpl<pta::PointerAnalysisFSInv>(
                    PS, _builder.get(), options));
        } else {
            assert(0 && "Wrong pointer analysis");
            abort();
        }
    }